

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O3

void __thiscall xe::xml::Tokenizer::Tokenizer(Tokenizer *this)

{
  uchar *puVar1;
  
  this->m_curToken = TOKEN_INCOMPLETE;
  this->m_curTokenLen = 0;
  this->m_state = STATE_DATA;
  (this->m_buf).m_numElements = 0;
  (this->m_buf).m_front = 0;
  (this->m_buf).m_back = 0;
  (this->m_buf).m_size = 0x400;
  puVar1 = (uchar *)operator_new__(0x400);
  (this->m_buf).m_buffer = puVar1;
  return;
}

Assistant:

Tokenizer::Tokenizer (void)
	: m_curToken	(TOKEN_INCOMPLETE)
	, m_curTokenLen	(0)
	, m_state		(STATE_DATA)
	, m_buf			(TOKENIZER_INITIAL_BUFFER_SIZE)
{
}